

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O2

void anon_unknown.dwarf_4654::Test_TemplateUtilTest_InitStaticTemplateStringForTest::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  int iVar3;
  char *__dest;
  TemplateId TVar4;
  char *pcVar5;
  undefined7 uStack_24f;
  TemplateDictionaryPeer peer;
  TemplateString local_238;
  TemplateDictionary dict;
  size_t local_210;
  TemplateString local_1a8;
  UnsafeArena arena;
  
  ctemplate::UnsafeArena::UnsafeArena(&arena,0x400);
  std::__cxx11::string::string((string *)&dict,"VALUE",(allocator *)&local_238);
  pcVar5 = _dict;
  __dest = ctemplate::UnsafeArena::Alloc(&arena,local_210);
  memcpy(__dest,pcVar5,local_210);
  TVar4 = ctemplate::GlobalIdForTest(_dict,(int)local_210);
  std::__cxx11::string::~string((string *)&dict);
  ctemplate::TemplateString::TemplateString(&local_238,"test_GetSectionValue");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_238,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_1a8,"value");
  TVar1._17_7_ = uStack_24f;
  TVar1.is_immutable_ = true;
  TVar1.length_ = local_210;
  TVar1.ptr_ = __dest;
  TVar1.id_ = TVar4;
  TVar2.length_ = local_1a8.length_;
  TVar2.ptr_ = local_1a8.ptr_;
  TVar2.is_immutable_ = local_1a8.is_immutable_;
  TVar2._17_7_ = local_1a8._17_7_;
  TVar2.id_ = local_1a8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar2);
  local_238.is_immutable_ = true;
  peer.dict_ = &dict;
  local_238.ptr_ = __dest;
  local_238.id_ = TVar4;
  pcVar5 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_238);
  iVar3 = strcmp("value",pcVar5);
  if (iVar3 == 0) {
    ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
    ctemplate::BaseArena::~BaseArena(&arena.super_BaseArena);
    return;
  }
  fprintf(_stderr,"Check failed: %s\n","strcmp(\"value\", peer.GetSectionValue(kValue)) == 0");
  exit(1);
}

Assistant:

TEST(TemplateUtilTest, InitStaticTemplateStringForTest) {
  UnsafeArena arena(1024);
  StaticTemplateString kValue = GetTestTemplateString(&arena);

  TemplateDictionary dict("test_GetSectionValue");
  dict.SetValue(kValue, "value");

  TemplateDictionaryPeer peer(&dict);
  EXPECT_STREQ("value", peer.GetSectionValue(kValue));
}